

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testCaseStarting(XmlReporter *this,TestCaseInfo *testInfo)

{
  int iVar1;
  XmlWriter *this_00;
  IConfig *pIVar2;
  Catch local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  TestCaseInfo *local_18;
  TestCaseInfo *testInfo_local;
  XmlReporter *this_local;
  
  local_18 = testInfo;
  testInfo_local = (TestCaseInfo *)this;
  StreamingReporterBase::testCaseStarting(&this->super_StreamingReporterBase,testInfo);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"TestCase",&local_39);
  this_00 = XmlWriter::startElement(&this->m_xml,(string *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"name",&local_71);
  trim(local_98,&local_18->name);
  XmlWriter::writeAttribute(this_00,(string *)local_70,(string *)local_98);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pIVar2 = Ptr<const_Catch::IConfig>::operator->(&(this->super_StreamingReporterBase).m_config);
  iVar1 = (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])();
  if (iVar1 == 1) {
    Timer::start(&this->m_testCaseTimer);
  }
  return;
}

Assistant:

virtual void testCaseStarting( TestCaseInfo const& testInfo ) CATCH_OVERRIDE {
            StreamingReporterBase::testCaseStarting(testInfo);
            m_xml.startElement( "TestCase" ).writeAttribute( "name", trim( testInfo.name ) );

            if ( m_config->showDurations() == ShowDurations::Always )
                m_testCaseTimer.start();
        }